

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRules
          (cmNinjaNormalTargetGenerator *this,string *config)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  undefined8 uVar1;
  TargetType targetType;
  cmLocalNinjaGenerator *pcVar2;
  string *psVar3;
  cmGlobalNinjaGenerator *pcVar4;
  cmGeneratorTarget *pcVar5;
  cmMakefile *this_00;
  pointer this_01;
  string *local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_730;
  string *local_668;
  string local_618;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f3;
  undefined1 local_5f2;
  allocator<char> local_5f1;
  string local_5f0;
  string *local_5d0;
  string local_5c8;
  iterator local_5a8;
  size_type local_5a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  string local_580;
  string local_560;
  string local_540;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_519;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  iterator local_4f0;
  size_type local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  string local_4c8;
  string local_4a8;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_> local_488;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_478;
  undefined1 local_458 [8];
  string compileCmd;
  allocator<char> local_411;
  string local_410;
  undefined1 local_3f0 [8];
  string flags;
  string local_3c8;
  undefined1 local_3a8 [8];
  string linker;
  RuleVariables vars;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20b;
  undefined1 local_20a;
  allocator<char> local_209;
  string local_208;
  string *local_1e8;
  string local_1e0;
  iterator local_1c0;
  size_type local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  string local_198;
  string local_168;
  undefined1 local_148 [8];
  cmNinjaRule rule;
  cmMakefile *mf;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  rule._288_8_ = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  LanguageLinkerCudaDeviceRule(&local_168,this,config);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  pcVar2 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  uVar1 = rule._288_8_;
  local_20a = 1;
  local_1e8 = &local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"CMAKE_CUDA_DEVICE_LINKER",&local_209);
  psVar3 = cmMakefile::GetRequiredDefinition((cmMakefile *)uVar1,&local_208);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[35]>
            (&local_1e0,psVar3,(char (*) [35])" -arch=$ARCH $REGISTER -o=$out $in");
  local_20a = 0;
  local_1c0 = &local_1e0;
  local_1b8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_20b);
  __l_01._M_len = local_1b8;
  __l_01._M_array = local_1c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l_01,&local_20b);
  std::__cxx11::string::string((string *)&vars.Launcher);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_198,pcVar2,&local_1b0,config,config,(string *)&vars.Launcher,
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&vars.Launcher);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_20b);
  local_668 = (string *)&local_1c0;
  do {
    local_668 = local_668 + -1;
    std::__cxx11::string::~string((string *)local_668);
  } while (local_668 != &local_1e0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),"Rule for CUDA device linking.");
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),"Linking CUDA $out");
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_148);
  cmRulePlaceholderExpander::RuleVariables::RuleVariables
            ((RuleVariables *)((long)&linker.field_2 + 8));
  pcVar5 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetName_abi_cxx11_(pcVar5);
  linker.field_2._8_8_ = std::__cxx11::string::c_str();
  pcVar5 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  targetType = cmGeneratorTarget::GetType(pcVar5);
  cmState::GetTargetTypeName_abi_cxx11_(targetType);
  vars.CMTargetName = (char *)std::__cxx11::string::c_str();
  vars.TargetVersionMinor = "CUDA";
  vars.Output = "$out";
  vars.CudaCompileMode = "$FATBIN";
  vars.Fatbinary = "$REGISTER";
  vars.Linker = "$LINK_FLAGS";
  pcVar5 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"CUDA",(allocator<char> *)(flags.field_2._M_local_buf + 0xf));
  cmGeneratorTarget::GetLinkerTool((string *)local_3a8,pcVar5,&local_3c8,config);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)(flags.field_2._M_local_buf + 0xf));
  vars.TargetInstallNameDir = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"CUDA",&local_411);
  std::__cxx11::string::string((string *)(compileCmd.field_2._M_local_buf + 8));
  cmCommonTargetGenerator::GetFlags
            ((string *)local_3f0,(cmCommonTargetGenerator *)this,&local_410,config,
             (string *)(compileCmd.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(compileCmd.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
  this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"CMAKE_CUDA_DEVICE_LINK_COMPILE",
             (allocator<char> *)
             ((long)&rulePlaceholderExpander._M_t.
                     super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                     .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7));
  psVar3 = cmMakefile::GetRequiredDefinition(this_00,&local_478);
  std::__cxx11::string::string((string *)local_458,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rulePlaceholderExpander._M_t.
                     super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                     .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7));
  pcVar2 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
    _vptr_cmOutputConverter[6])(&local_488);
  this_01 = std::
            unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
            operator->(&local_488);
  pcVar2 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  cmRulePlaceholderExpander::ExpandRuleVariables
            (this_01,(cmOutputConverter *)pcVar2,(string *)local_458,
             (RuleVariables *)((long)&linker.field_2 + 8));
  LanguageLinkerCudaDeviceCompileRule(&local_4a8,this,config);
  std::__cxx11::string::operator=((string *)local_148,(string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  pcVar2 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  local_518 = &local_510;
  std::__cxx11::string::string((string *)local_518,(string *)local_458);
  local_4f0 = &local_510;
  local_4e8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_519);
  __l_00._M_len = local_4e8;
  __l_00._M_array = local_4f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4e0,__l_00,&local_519);
  std::__cxx11::string::string((string *)&local_540);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_4c8,pcVar2,&local_4e0,config,config,&local_540,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_540);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_519);
  local_730 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4f0;
  do {
    local_730 = local_730 + -1;
    std::__cxx11::string::~string((string *)local_730);
  } while (local_730 != &local_510);
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),
             "Rule for compiling CUDA device stubs.");
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),"Compiling CUDA device stub $out");
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_148);
  LanguageLinkerCudaFatbinaryRule(&local_560,this,config);
  std::__cxx11::string::operator=((string *)local_148,(string *)&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  pcVar2 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  uVar1 = rule._288_8_;
  local_5f2 = 1;
  local_5d0 = &local_5c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"CMAKE_CUDA_FATBINARY",&local_5f1);
  psVar3 = cmMakefile::GetRequiredDefinition((cmMakefile *)uVar1,&local_5f0);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[82]>
            (&local_5c8,psVar3,
             (char (*) [82])
             " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$out $PROFILES");
  local_5f2 = 0;
  local_5a8 = &local_5c8;
  local_5a0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_5f3);
  __l._M_len = local_5a0;
  __l._M_array = local_5a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_598,__l,&local_5f3);
  std::__cxx11::string::string((string *)&local_618);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_580,pcVar2,&local_598,config,config,&local_618,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_618);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_598);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_5f3);
  local_790 = (string *)&local_5a8;
  do {
    local_790 = local_790 + -1;
    std::__cxx11::string::~string((string *)local_790);
  } while (local_790 != &local_5c8);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),"Rule for CUDA fatbinaries.");
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),"Creating fatbinary $out");
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)local_148);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr(&local_488);
  std::__cxx11::string::~string((string *)local_458);
  std::__cxx11::string::~string((string *)local_3f0);
  std::__cxx11::string::~string((string *)local_3a8);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_148);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRules(
  const std::string& config)
{
  const cmMakefile* mf = this->GetMakefile();

  cmNinjaRule rule(this->LanguageLinkerCudaDeviceRule(config));
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
               " -arch=$ARCH $REGISTER -o=$out $in") },
    config, config);
  rule.Comment = "Rule for CUDA device linking.";
  rule.Description = "Linking CUDA $out";
  this->GetGlobalGenerator()->AddRule(rule);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = "$out";
  vars.Fatbinary = "$FATBIN";
  vars.RegisterFile = "$REGISTER";
  vars.LinkFlags = "$LINK_FLAGS";
  std::string linker =
    this->GetGeneratorTarget()->GetLinkerTool("CUDA", config);
  vars.Linker = linker.c_str();

  std::string flags = this->GetFlags("CUDA", config);
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetMakefile()->GetRequiredDefinition(
    "CMAKE_CUDA_DEVICE_LINK_COMPILE");
  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();
  rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                               compileCmd, vars);

  rule.Name = this->LanguageLinkerCudaDeviceCompileRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine({ compileCmd },
                                                             config, config);
  rule.Comment = "Rule for compiling CUDA device stubs.";
  rule.Description = "Compiling CUDA device stub $out";
  this->GetGlobalGenerator()->AddRule(rule);

  rule.Name = this->LanguageLinkerCudaFatbinaryRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
               " -64 -cmdline=--compile-only -compress-all -link "
               "--embedded-fatbin=$out $PROFILES") },
    config, config);
  rule.Comment = "Rule for CUDA fatbinaries.";
  rule.Description = "Creating fatbinary $out";
  this->GetGlobalGenerator()->AddRule(rule);
}